

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

void ImGui::BulletTextV(char *fmt,__va_list_tag *args)

{
  ImGuiContext *pIVar1;
  bool bVar2;
  int iVar3;
  ImGuiWindow *pIVar4;
  char *text;
  float fVar5;
  float fVar6;
  ImVec2 IVar7;
  float local_b4;
  ImVec2 local_90;
  ImVec2 local_88;
  ImVec2 local_80;
  ImVec2 local_78;
  ImVec2 local_70;
  ImVec2 local_68;
  undefined1 local_60 [8];
  ImRect bb;
  float line_height;
  float text_base_offset_y;
  ImVec2 label_size;
  char *text_end;
  char *text_begin;
  ImGuiStyle *style;
  ImGuiContext *g;
  ImGuiWindow *window;
  __va_list_tag *args_local;
  char *fmt_local;
  
  pIVar4 = GetCurrentWindow();
  pIVar1 = GImGui;
  if ((pIVar4->SkipItems & 1U) == 0) {
    text = GImGui->TempBuffer;
    iVar3 = ImFormatStringV(GImGui->TempBuffer,0xc01,fmt,args);
    IVar7 = CalcTextSize(text,text + iVar3,false,-1.0);
    bb.Max.y = ImMax(0.0,(pIVar4->DC).CurrentLineTextBaseOffset);
    fVar5 = (pIVar1->Style).FramePadding.y;
    fVar5 = ImMin((pIVar4->DC).CurrentLineHeight,fVar5 + fVar5 + pIVar1->FontSize);
    bb.Max.x = ImMax(fVar5,pIVar1->FontSize);
    fVar5 = pIVar1->FontSize;
    line_height = IVar7.x;
    if (line_height <= 0.0) {
      local_b4 = 0.0;
    }
    else {
      fVar6 = (pIVar1->Style).FramePadding.x;
      local_b4 = fVar6 + fVar6 + line_height;
    }
    text_base_offset_y = IVar7.y;
    fVar6 = ImMax(bb.Max.x,text_base_offset_y);
    ImVec2::ImVec2(&local_70,fVar5 + local_b4,fVar6);
    local_68 = ::operator+(&(pIVar4->DC).CursorPos,&local_70);
    ImRect::ImRect((ImRect *)local_60,&(pIVar4->DC).CursorPos,&local_68);
    ItemSize((ImRect *)local_60,0.0);
    bVar2 = ItemAdd((ImRect *)local_60,(ImGuiID *)0x0);
    if (bVar2) {
      ImVec2::ImVec2(&local_80,pIVar1->FontSize * 0.5 + (pIVar1->Style).FramePadding.x,
                     bb.Max.x * 0.5);
      local_78 = ::operator+((ImVec2 *)local_60,&local_80);
      RenderBullet(local_78);
      fVar5 = (pIVar1->Style).FramePadding.x;
      ImVec2::ImVec2(&local_90,fVar5 + fVar5 + pIVar1->FontSize,bb.Max.y);
      local_88 = ::operator+((ImVec2 *)local_60,&local_90);
      RenderText(local_88,text,text + iVar3,false);
    }
  }
  return;
}

Assistant:

void ImGui::BulletTextV(const char* fmt, va_list args)
{
    ImGuiWindow* window = GetCurrentWindow();
    if (window->SkipItems)
        return;

    ImGuiContext& g = *GImGui;
    const ImGuiStyle& style = g.Style;

    const char* text_begin = g.TempBuffer;
    const char* text_end = text_begin + ImFormatStringV(g.TempBuffer, IM_ARRAYSIZE(g.TempBuffer), fmt, args);
    const ImVec2 label_size = CalcTextSize(text_begin, text_end, false);
    const float text_base_offset_y = ImMax(0.0f, window->DC.CurrentLineTextBaseOffset); // Latch before ItemSize changes it
    const float line_height = ImMax(ImMin(window->DC.CurrentLineHeight, g.FontSize + g.Style.FramePadding.y*2), g.FontSize);
    const ImRect bb(window->DC.CursorPos, window->DC.CursorPos + ImVec2(g.FontSize + (label_size.x > 0.0f ? (label_size.x + style.FramePadding.x*2) : 0.0f), ImMax(line_height, label_size.y)));  // Empty text doesn't add padding
    ItemSize(bb);
    if (!ItemAdd(bb, NULL))
        return;

    // Render
    RenderBullet(bb.Min + ImVec2(style.FramePadding.x + g.FontSize*0.5f, line_height*0.5f));
    RenderText(bb.Min+ImVec2(g.FontSize + style.FramePadding.x*2, text_base_offset_y), text_begin, text_end, false);
}